

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::~Array
          (Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *this)

{
  Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }